

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

endpoint * __thiscall
libtorrent::aux::session_impl::bind_outgoing_socket
          (endpoint *__return_storage_ptr__,session_impl *this,socket_type *s,
          address *remote_address,error_code *ec)

{
  long *plVar1;
  pointer pbVar2;
  pointer pbVar3;
  value_type *pvVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined7 uVar7;
  undefined1 uVar8;
  undefined7 uVar9;
  bool bVar10;
  int iVar11;
  variant_alternative_t<8UL,_variant<noexcept_move_only<basic_stream_socket<tcp,_any_executor<context_as_t<execution_context_&>,_never_t<0>,_prefer_only<possibly_t<0>_>,_prefer_only<tracked_t<0>_>,_prefer_only<untracked_t<0>_>,_prefer_only<fork_t<0>_>,_prefer_only<continuation_t<0>_>_>_>_>,_socks5_stream,_http_stream,_utp_stream,_i2p_stream,_ssl_stream<noexcept_move_only<basic_stream_socket<tcp,_any_executor<context_as_t<execution_context_&>,_never_t<0>,_prefer_only<possibly_t<0>_>,_prefer_only<tracked_t<0>_>,_prefer_only<untracked_t<0>_>,_prefer_only<fork_t<0>_>,_prefer_only<continuation_t<0>_>_>_>_>_>,_ssl_stream<socks5_stream>,_ssl_stream<http_stream>,_ssl_stream<utp_stream>_>_>
  *pvVar12;
  _Head_base<0UL,_boost::asio::ssl::stream<libtorrent::aux::utp_stream>_*,_false> this_00;
  element_type *peVar13;
  ulong uVar14;
  byte bVar15;
  shared_ptr<libtorrent::aux::listen_socket_t> *ls;
  value_type *__x;
  bool bVar16;
  undefined8 uVar17;
  error_category *peVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  shared_ptr<libtorrent::aux::listen_socket_t> match;
  endpoint bind_ep;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  with_gateways;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  data_union local_94;
  undefined1 local_78 [32];
  address local_58;
  undefined8 local_38;
  
  local_58.ipv6_address_.addr_.__in6_u._8_8_ = 0;
  local_58.ipv6_address_.scope_id_ = 0;
  local_58.type_ = 0;
  local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
  local_58.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
  local_58.ipv6_address_.addr_.__in6_u._1_7_ = 0;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)&local_94.base,(address *)(local_78 + 0x20),0);
  local_58._0_8_ = &(this->m_settings).m_mutex;
  local_58.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_78 + 0x20));
  local_58.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\x01';
  iVar11 = (this->m_settings).m_store.m_ints._M_elems[0x26];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_78 + 0x20));
  uVar9 = local_58.ipv6_address_.addr_.__in6_u._1_7_;
  uVar8 = local_58.ipv6_address_.addr_.__in6_u.__u6_addr8[0];
  local_58.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = (uint8_t)ec;
  uVar6 = local_58.ipv6_address_.addr_.__in6_u.__u6_addr8[0];
  local_58.ipv6_address_.addr_.__in6_u._1_7_ = (undefined7)((ulong)ec >> 8);
  uVar7 = local_58.ipv6_address_.addr_.__in6_u._1_7_;
  if (0 < iVar11) {
    local_58._0_8_ = local_78;
    local_78._0_4_ = 1;
    ::std::
    visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
              ((anon_class_16_2_c962e082 *)(local_78 + 0x20),
               &s->
                super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              );
    ec->val_ = 0;
    ec->failed_ = false;
    ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
    iVar11 = next_port(this);
    local_94.v4.sin_port = (ushort)iVar11 << 8 | (ushort)iVar11 >> 8;
    uVar8 = local_58.ipv6_address_.addr_.__in6_u.__u6_addr8[0];
    uVar9 = local_58.ipv6_address_.addr_.__in6_u._1_7_;
  }
  local_58.ipv6_address_.addr_.__in6_u._1_7_ = uVar9;
  local_58.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = uVar8;
  bVar10 = is_utp(s);
  if (!bVar10) {
    pbVar2 = (this->m_outgoing_interfaces).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->m_outgoing_interfaces).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar2 == pbVar3) {
      uVar5 = local_94.v4.sin_addr.s_addr;
      if (local_94.base.sa_family != 2) {
        auVar20[0] = -(local_94.base.sa_data[6] == '\0');
        auVar20[1] = -(local_94.base.sa_data[7] == '\0');
        auVar20[2] = -(local_94.base.sa_data[8] == '\0');
        auVar20[3] = -(local_94.base.sa_data[9] == '\0');
        auVar20[4] = -(local_94.base.sa_data[10] == '\0');
        auVar20[5] = -(local_94.base.sa_data[0xb] == '\0');
        auVar20[6] = -(local_94.base.sa_data[0xc] == '\0');
        auVar20[7] = -(local_94.base.sa_data[0xd] == '\0');
        auVar20[8] = -(local_94._16_1_ == '\0');
        auVar20[9] = -(local_94._17_1_ == '\0');
        auVar20[10] = -(local_94._18_1_ == '\0');
        auVar20[0xb] = -(local_94._19_1_ == '\0');
        auVar20[0xc] = -(local_94._20_1_ == '\0');
        auVar20[0xd] = -(local_94._21_1_ == '\0');
        auVar20[0xe] = -(local_94._22_1_ == '\0');
        auVar20[0xf] = -(local_94._23_1_ == '\0');
        uVar5 = (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar20[0xf] >> 7) << 0xf) ^ 0xffff;
      }
      if (uVar5 == 0) {
        local_58.ipv6_address_.scope_id_ = 0;
        local_58.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_58.ipv6_address_.addr_.__in6_u._1_7_ = 0;
        local_58.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
        local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        local_58.type_ = (anon_enum_32)(remote_address->type_ == ipv6);
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                  ((basic_endpoint<boost::asio::ip::tcp> *)&local_94.base,
                   (address *)(local_78 + 0x20));
      }
      local_58.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = uVar6;
      local_58.ipv6_address_.addr_.__in6_u._1_7_ = uVar7;
      local_58._0_8_ = &local_94;
      ::std::
      visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
                ((anon_class_16_2_e6882782 *)(local_78 + 0x20),
                 &s->
                  super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                );
      uVar17 = CONCAT44(local_94.v6.sin6_flowinfo,
                        CONCAT22(local_94.v4.sin_port,local_94.base.sa_family));
      peVar18 = (error_category *)
                CONCAT17(local_94.base.sa_data[0xd],
                         CONCAT16(local_94.base.sa_data[0xc],
                                  CONCAT15(local_94.base.sa_data[0xb],
                                           CONCAT14(local_94.base.sa_data[10],
                                                    CONCAT13(local_94.base.sa_data[9],
                                                             CONCAT12(local_94.base.sa_data[8],
                                                                      CONCAT11(local_94.base.sa_data
                                                                               [7],local_94.base.
                                                                                   sa_data[6])))))))
      ;
      uVar19 = CONCAT17(local_94._19_1_,
                        CONCAT16(local_94._18_1_,
                                 CONCAT15(local_94._17_1_,
                                          CONCAT14(local_94._16_1_,
                                                   CONCAT13(local_94.base.sa_data[0xd],
                                                            CONCAT12(local_94.base.sa_data[0xc],
                                                                     CONCAT11(local_94.base.sa_data
                                                                              [0xb],local_94.base.
                                                                                    sa_data[10])))))
                                ));
      uVar21 = CONCAT44(local_94.v6.sin6_scope_id,
                        CONCAT13(local_94._23_1_,
                                 CONCAT12(local_94._22_1_,CONCAT11(local_94._21_1_,local_94._20_1_))
                                ));
    }
    else {
      bVar15 = this->m_interface_index;
      if ((ulong)((long)pbVar3 - (long)pbVar2 >> 5) <= (ulong)bVar15) {
        this->m_interface_index = '\0';
        bVar15 = 0;
      }
      this->m_interface_index = bVar15 + 1;
      local_78._0_4_ = (uint)(remote_address->type_ != ipv4) * 8 + 2;
      bind_socket_to_device<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>>
                ((address *)(local_78 + 0x20),(aux *)this->m_io_context,(io_context *)s,
                 (polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                  *)local_78,(tcp *)pbVar2[bVar15]._M_dataplus._M_p,
                 (char *)(ulong)(ushort)(local_94.v4.sin_port << 8 | local_94.v4.sin_port >> 8),
                 (int)ec,(error_code *)__return_storage_ptr__);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                ((basic_endpoint<boost::asio::ip::tcp> *)&local_94.base,(address *)(local_78 + 0x20)
                );
      uVar17 = CONCAT44(local_94.v6.sin6_flowinfo,
                        CONCAT22(local_94.v4.sin_port,local_94.base.sa_family));
      peVar18 = (error_category *)
                CONCAT17(local_94.base.sa_data[0xd],
                         CONCAT16(local_94.base.sa_data[0xc],
                                  CONCAT15(local_94.base.sa_data[0xb],
                                           CONCAT14(local_94.base.sa_data[10],
                                                    CONCAT13(local_94.base.sa_data[9],
                                                             CONCAT12(local_94.base.sa_data[8],
                                                                      CONCAT11(local_94.base.sa_data
                                                                               [7],local_94.base.
                                                                                   sa_data[6])))))))
      ;
      uVar19 = CONCAT17(local_94._19_1_,
                        CONCAT16(local_94._18_1_,
                                 CONCAT15(local_94._17_1_,
                                          CONCAT14(local_94._16_1_,
                                                   CONCAT13(local_94.base.sa_data[0xd],
                                                            CONCAT12(local_94.base.sa_data[0xc],
                                                                     CONCAT11(local_94.base.sa_data
                                                                              [0xb],local_94.base.
                                                                                    sa_data[10])))))
                                ));
      uVar21 = CONCAT44(local_94.v6.sin6_scope_id,
                        CONCAT13(local_94._23_1_,
                                 CONCAT12(local_94._22_1_,CONCAT11(local_94._21_1_,local_94._20_1_))
                                ));
    }
    *(undefined8 *)((long)&((error_code *)__return_storage_ptr__)->cat_ + 4) = uVar19;
    *(undefined8 *)&((error_code *)((long)__return_storage_ptr__ + 0x10))->failed_ = uVar21;
    ((error_code *)__return_storage_ptr__)->val_ = (int)uVar17;
    ((error_code *)__return_storage_ptr__)->failed_ = (bool)(char)((ulong)uVar17 >> 0x20);
    *(int3 *)&((error_code *)__return_storage_ptr__)->field_0x5 = (int3)((ulong)uVar17 >> 0x28);
    ((error_code *)__return_storage_ptr__)->cat_ = peVar18;
    return __return_storage_ptr__;
  }
  bVar10 = *(__index_type *)
            ((long)&(s->
                    super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                    ).
                    super__Variant_base<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                    .
                    super__Move_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                    .
                    super__Copy_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                    .
                    super__Move_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                    .
                    super__Copy_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                    .
                    super__Variant_storage_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
            + 0x170) != '\b';
  if (bVar10) {
    this_00._M_head_impl =
         (stream<libtorrent::aux::utp_stream> *)
         ::std::
         get<3ul,libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>
                   (&s->
                     super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                   );
  }
  else {
    pvVar12 = ::std::
              get<8ul,libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>
                        (&s->
                          super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                        );
    this_00._M_head_impl =
         (pvVar12->m_sock)._M_t.
         super___uniq_ptr_impl<boost::asio::ssl::stream<libtorrent::aux::utp_stream>,_std::default_delete<boost::asio::ssl::stream<libtorrent::aux::utp_stream>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_boost::asio::ssl::stream<libtorrent::aux::utp_stream>_*,_std::default_delete<boost::asio::ssl::stream<libtorrent::aux::utp_stream>_>_>
         .super__Head_base<0UL,_boost::asio::ssl::stream<libtorrent::aux::utp_stream>_*,_false>.
         _M_head_impl;
  }
  local_38 = utp_stream::get_impl(&(this_00._M_head_impl)->next_layer_);
  local_78._0_16_ = (undefined1  [16])0x0;
  local_78._16_8_ = 0;
  local_a8 = (element_type *)0x0;
  __x = (this->m_listen_sockets).
        super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x == pvVar4) {
LAB_002c9640:
    if (local_78._0_8_ != local_78._8_8_) {
      uVar14 = random((aux *)(ulong)((int)((ulong)(local_78._8_8_ - local_78._0_8_) >> 4) - 1));
      plVar1 = (long *)(local_78._0_8_ + (uVar14 & 0xffffffff) * 0x10);
      local_a8 = (element_type *)*plVar1;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_a0,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar1 + 1));
      if (local_a8 != (element_type *)0x0) goto LAB_002c9692;
    }
    ec->val_ = 0x5f;
    ec->failed_ = true;
    ec->cat_ = &boost::system::detail::cat_holder<void>::generic_category_instance.
                super_error_category;
    *(undefined1 (*) [16])&((error_code *)__return_storage_ptr__)->cat_ = (undefined1  [16])0x0;
    *(undefined4 *)&((error_code *)((long)__return_storage_ptr__ + 0x10))->cat_ = 0;
    ((error_code *)__return_storage_ptr__)->val_ = 2;
    ((error_code *)__return_storage_ptr__)->failed_ = false;
    *(undefined3 *)&((error_code *)__return_storage_ptr__)->field_0x5 = 0;
  }
  else {
    do {
      peVar13 = (__x->
                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      bVar15 = (peVar13->flags).m_val;
      if ((((bVar15 & 8) != 0) ||
          ((remote_address->type_ == ipv4) ==
           ((peVar13->local_endpoint).impl_.data_.base.sa_family == 2))) &&
         ((bool)peVar13->ssl == !bVar10)) {
        if ((bVar15 & 2) == 0) {
          ::std::
          vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
          ::push_back((vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                       *)local_78,__x);
          peVar13 = (__x->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
          bVar15 = (peVar13->flags).m_val;
        }
        if ((bVar15 & 8) == 0) {
          bVar16 = (peVar13->local_endpoint).impl_.data_.base.sa_family != 2;
          if (bVar16) {
            uVar17 = *(undefined8 *)((long)&(peVar13->local_endpoint).impl_.data_ + 8);
            local_58.ipv6_address_.addr_.__in6_u._8_8_ =
                 *(undefined8 *)((long)&(peVar13->local_endpoint).impl_.data_ + 0x10);
            local_58.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = (uint8_t)uVar17;
            local_58.ipv6_address_.addr_.__in6_u._1_7_ = (undefined7)((ulong)uVar17 >> 8);
            local_58.ipv6_address_.scope_id_ =
                 (unsigned_long)(peVar13->local_endpoint).impl_.data_.v6.sin6_scope_id;
            local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
          }
          else {
            local_58.ipv4_address_.addr_.s_addr =
                 (in4_addr_type)(peVar13->local_endpoint).impl_.data_.v6.sin6_flowinfo;
            local_58.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
            local_58.ipv6_address_.addr_.__in6_u._1_7_ = 0;
            local_58.ipv6_address_.addr_.__in6_u._8_8_ = 0;
            local_58.ipv6_address_.scope_id_ = 0;
          }
          local_58.type_ = (anon_enum_32)bVar16;
          bVar16 = match_addr_mask((address *)(local_78 + 0x20),remote_address,
                                   &((__x->
                                     super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->netmask);
          if (!bVar16) goto LAB_002c9629;
        }
        local_a8 = (__x->
                   super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&_Stack_a0,
                   &(__x->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount);
      }
LAB_002c9629:
      __x = __x + 1;
    } while (__x != pvVar4);
    if (local_a8 == (element_type *)0x0) goto LAB_002c9640;
LAB_002c9692:
    *(element_type **)local_38 = local_a8;
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8),&_Stack_a0);
    uVar17 = *(undefined8 *)&(local_a8->local_endpoint).impl_.data_;
    peVar18 = *(error_category **)((long)&(local_a8->local_endpoint).impl_.data_ + 8);
    uVar19 = *(undefined8 *)((long)&(local_a8->local_endpoint).impl_.data_ + 0xc);
    uVar21 = *(undefined8 *)((long)&(local_a8->local_endpoint).impl_.data_ + 0x14);
    ((error_code *)__return_storage_ptr__)->val_ = (int)uVar17;
    ((error_code *)__return_storage_ptr__)->failed_ = (bool)(char)((ulong)uVar17 >> 0x20);
    *(int3 *)&((error_code *)__return_storage_ptr__)->field_0x5 = (int3)((ulong)uVar17 >> 0x28);
    ((error_code *)__return_storage_ptr__)->cat_ = peVar18;
    *(undefined8 *)((long)&((error_code *)__return_storage_ptr__)->cat_ + 4) = uVar19;
    *(undefined8 *)&((error_code *)((long)__return_storage_ptr__ + 0x10))->failed_ = uVar21;
  }
  ::std::
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  ::~vector((vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             *)local_78);
  return (endpoint *)(error_code *)__return_storage_ptr__;
}

Assistant:

tcp::endpoint session_impl::bind_outgoing_socket(socket_type& s
		, address const& remote_address, error_code& ec) const
	{
		tcp::endpoint bind_ep(address_v4(), 0);
		if (m_settings.get_int(settings_pack::outgoing_port) > 0)
		{
#ifdef TORRENT_WINDOWS
			s.set_option(exclusive_address_use(true), ec);
#else
			s.set_option(tcp::acceptor::reuse_address(true), ec);
#endif
			// ignore errors because the underlying socket may not
			// be opened yet. This happens when we're routing through
			// a proxy. In that case, we don't yet know the address of
			// the proxy server, and more importantly, we don't know
			// the address family of its address. This means we can't
			// open the socket yet. The socks abstraction layer defers
			// opening it.
			ec.clear();
			bind_ep.port(std::uint16_t(next_port()));
		}

		if (is_utp(s))
		{
			// TODO: factor out this logic into a separate function for unit
			// testing

			utp_socket_impl* impl = nullptr;
			transport ssl = transport::plaintext;
#if TORRENT_USE_SSL
			if (std::get_if<ssl_stream<utp_stream>>(&s.var()) != nullptr)
			{
				impl = std::get<ssl_stream<utp_stream>>(s).next_layer().get_impl();
				ssl = transport::ssl;
			}
			else
#endif
				impl = std::get<utp_stream>(s).get_impl();

			std::vector<std::shared_ptr<listen_socket_t>> with_gateways;
			std::shared_ptr<listen_socket_t> match;
			for (auto const& ls : m_listen_sockets)
			{
				// this is almost, but not quite, like can_route()
				if (!(ls->flags & listen_socket_t::proxy)
					&& is_v4(ls->local_endpoint) != remote_address.is_v4())
					continue;
				if (ls->ssl != ssl) continue;
				if (!(ls->flags & listen_socket_t::local_network))
					with_gateways.push_back(ls);

				if (ls->flags & listen_socket_t::proxy
					|| match_addr_mask(ls->local_endpoint.address(), remote_address, ls->netmask))
				{
					// is this better than the previous match?
					match = ls;
				}
			}
			if (!match && !with_gateways.empty())
				match = with_gateways[random(std::uint32_t(with_gateways.size() - 1))];

			if (match)
			{
				impl->m_sock = match;
				return match->local_endpoint;
			}
			ec.assign(boost::system::errc::not_supported, generic_category());
			return {};
		}

		if (!m_outgoing_interfaces.empty())
		{
			if (m_interface_index >= m_outgoing_interfaces.size()) m_interface_index = 0;
			std::string const& ifname = m_outgoing_interfaces[m_interface_index++];

			bind_ep.address(bind_socket_to_device(m_io_context, s
				, remote_address.is_v4() ? tcp::v4() : tcp::v6()
				, ifname.c_str(), bind_ep.port(), ec));
			return bind_ep;
		}

		// if we're not binding to a specific interface, bind
		// to the same protocol family as the target endpoint
		if (bind_ep.address().is_unspecified())
		{
			if (remote_address.is_v6())
				bind_ep.address(address_v6::any());
			else
				bind_ep.address(address_v4::any());
		}

		s.bind(bind_ep, ec);
		return bind_ep;
	}